

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *this,int dimension,
          unsigned_short *vertices,pair<int,_float> _data,int offset)

{
  bool bVar1;
  runtime_error *prVar2;
  int iVar3;
  undefined8 in_RDX;
  int in_ESI;
  pair<int,_float> in_RDI;
  int in_R8D;
  iterator pair;
  map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *in_stack_ffffffffffffff98;
  _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *in_stack_ffffffffffffffa0;
  _Self local_48;
  _Self local_40 [2];
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int dimension_00;
  undefined4 in_stack_ffffffffffffffe8;
  pair<int,_float> local_8;
  
  dimension_00 = (int)((ulong)in_RDX >> 0x20);
  if (in_ESI == 0) {
    std::pair<int,_float>::operator=((pair<int,_float> *)((long)in_RDI + 4),&local_8);
  }
  else {
    if (*(long *)((long)in_RDI + 0x10) == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"A cell could not be found in the directed flag complex.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = in_R8D + 1;
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::find(in_stack_ffffffffffffff98,(key_type *)0x1bf9d2);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator==(local_40,&local_48);
    if (bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"A cell could not be found in the directed flag complex.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
    ::operator->(in_stack_ffffffffffffffa0);
    set_data<unsigned_short*>
              ((directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)
               CONCAT44(in_ESI,in_stack_ffffffffffffffe8),dimension_00,
               (unsigned_short *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),in_RDI,
               in_stack_ffffffffffffffd4);
  }
  return;
}

Assistant:

void set_data(int dimension, const Cell vertices, ExtraData _data, int offset = 0) {
		if (dimension == 0) {
			data = _data;
			return;
		}

		if (children == nullptr) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		offset++;
		auto pair = children->find(vertices[offset]);
		if (pair == children->end()) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		pair->second.set_data(dimension - 1, vertices, _data, offset);
	}